

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

string * __thiscall
pbrt::SimpleVolPathIntegrator::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SimpleVolPathIntegrator *this)

{
  int *in_RCX;
  
  StringPrintf<int_const&>
            (__return_storage_ptr__,(pbrt *)"[ SimpleVolPathIntegrator maxDepth: %d ] ",
             (char *)&this->maxDepth,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleVolPathIntegrator::ToString() const {
    return StringPrintf("[ SimpleVolPathIntegrator maxDepth: %d ] ", maxDepth);
}